

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void VW::finish(vw *all,bool delete_all)

{
  options_i *poVar1;
  parser *ppVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  uint64_t uVar6;
  size_t sVar7;
  int *piVar8;
  _func_void_substring_features_ptr *p_Var9;
  undefined8 uVar10;
  byte in_SIL;
  vw *in_RDI;
  double dVar11;
  size_t i_1;
  size_t i;
  bool seeded;
  vw_exception *e;
  bool finalize_regressor_exception_thrown;
  vw_exception finalize_regressor_exception;
  float best_constant_loss;
  float best_constant;
  parameters *in_stack_fffffffffffffe78;
  vw *in_stack_fffffffffffffe80;
  vw_exception *ex;
  parser *in_stack_fffffffffffffe90;
  vw *this;
  string *in_stack_fffffffffffffe98;
  _func_void_substring_features_ptr *func;
  v_hashmap<substring,_features_*> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  vw_exception *in_stack_fffffffffffffeb0;
  size_t sVar12;
  byte local_f1;
  _func_void_substring_features_ptr *local_f0;
  size_t local_e8;
  string local_d0 [38];
  byte local_aa;
  allocator local_a9;
  string local_a8 [16];
  float *in_stack_ffffffffffffff68;
  float *in_stack_ffffffffffffff70;
  vw *in_stack_ffffffffffffff78;
  vw *in_stack_ffffffffffffff80;
  float local_50;
  float local_4c;
  allocator local_31;
  string local_30 [39];
  byte local_9;
  vw *local_8;
  
  local_9 = in_SIL & 1;
  local_f1 = 0;
  local_8 = in_RDI;
  if ((in_RDI->quiet & 1U) == 0) {
    poVar1 = in_RDI->options;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"audit_regressor",&local_31);
    iVar4 = (*poVar1->_vptr_options_i[1])(poVar1,local_30);
    local_f1 = (byte)iVar4 ^ 0xff;
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  if ((local_f1 & 1) != 0) {
    std::ios_base::precision
              ((ios_base *)
               ((local_8->trace_message).super_ostream._vptr_basic_ostream[-3] +
               (long)&(local_8->trace_message).super_ostream._vptr_basic_ostream),6);
    std::ostream::operator<<(&local_8->trace_message,std::fixed);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar5,"finished run");
    if ((local_8->current_pass == 0) || (local_8->current_pass == 1)) {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"number of examples = ");
      std::ostream::operator<<(poVar5,local_8->sd->example_number);
    }
    else {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"number of examples per pass = ");
      std::ostream::operator<<(poVar5,local_8->sd->example_number / local_8->current_pass);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"passes used = ");
      std::ostream::operator<<(poVar5,local_8->current_pass);
    }
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"weighted example sum = ");
    dVar11 = shared_data::weighted_examples(local_8->sd);
    std::ostream::operator<<(poVar5,dVar11);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"weighted label sum = ");
    std::ostream::operator<<(poVar5,local_8->sd->weighted_labels);
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar5,"average loss = ");
    if ((local_8->holdout_set_off & 1U) == 0) {
      dVar11 = local_8->sd->holdout_best_loss;
      if (((dVar11 == 3.4028234663852886e+38) && (!NAN(dVar11))) ||
         ((dVar11 = local_8->sd->holdout_best_loss, dVar11 == 1.7014117331926443e+38 &&
          (!NAN(dVar11))))) {
        std::operator<<(&(local_8->trace_message).super_ostream,"undefined (no holdout)");
      }
      else {
        poVar5 = (ostream *)
                 std::ostream::operator<<(&local_8->trace_message,local_8->sd->holdout_best_loss);
        std::operator<<(poVar5," h");
      }
    }
    else if (local_8->sd->weighted_labeled_examples <= 0.0) {
      std::operator<<(&(local_8->trace_message).super_ostream,"n.a.");
    }
    else {
      std::ostream::operator<<
                (&local_8->trace_message,
                 local_8->sd->sum_loss / local_8->sd->weighted_labeled_examples);
    }
    if ((local_8->sd->report_multiclass_log_loss & 1U) != 0) {
      if ((local_8->holdout_set_off & 1U) == 0) {
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"average multiclass log loss = ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,local_8->sd->holdout_multiclass_log_loss /
                                   local_8->sd->weighted_labeled_examples);
        std::operator<<(poVar5," h");
      }
      else {
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"average multiclass log loss = ");
        std::ostream::operator<<
                  (poVar5,local_8->sd->multiclass_log_loss / local_8->sd->weighted_labeled_examples)
        ;
      }
    }
    bVar3 = get_best_constant(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                              in_stack_ffffffffffffff68);
    if (bVar3) {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"best constant = ");
      std::ostream::operator<<(poVar5,local_4c);
      if ((local_50 != 1.1754944e-38) || (NAN(local_50))) {
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<(poVar5,"best constant\'s loss = ");
        std::ostream::operator<<(poVar5,local_50);
      }
    }
    poVar5 = (ostream *)
             std::ostream::operator<<
                       (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"total feature number = ");
    std::ostream::operator<<(poVar5,local_8->sd->total_features);
    if (local_8->sd->queries != 0) {
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (&local_8->trace_message,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<(poVar5,"total queries = ");
      std::ostream::operator<<(poVar5,local_8->sd->queries);
    }
    std::ostream::operator<<(&local_8->trace_message,std::endl<char,std::char_traits<char>>);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"empty",&local_a9);
  vw_exception::vw_exception
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),in_stack_fffffffffffffe98);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  local_aa = 0;
  std::__cxx11::string::string(local_d0,(string *)&local_8->final_regressor_name);
  finalize_regressor(in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_d0);
  if (local_8->l != (base_learner *)0x0) {
    LEARNER::learner<char,_char>::finish((learner<char,_char> *)in_stack_fffffffffffffe80);
    free_it((void *)0x144c3e);
  }
  if (((local_8->should_delete_options & 1U) != 0) && (local_8->options != (options_i *)0x0)) {
    (*local_8->options->_vptr_options_i[9])();
  }
  free_parser(in_stack_fffffffffffffe80);
  finalize_source(in_stack_fffffffffffffe90);
  v_array<substring>::clear((v_array<substring> *)in_stack_fffffffffffffe80);
  v_array<substring>::delete_v((v_array<substring> *)in_stack_fffffffffffffe80);
  ppVar2 = local_8->p;
  if (ppVar2 != (parser *)0x0) {
    parser::~parser(in_stack_fffffffffffffe90);
    operator_delete(ppVar2);
  }
  uVar6 = parameters::seeded(in_stack_fffffffffffffe78);
  if (uVar6 == 0) {
    if (local_8->sd->ldict != (namedlabels *)0x0) {
      namedlabels::~namedlabels((namedlabels *)in_stack_fffffffffffffe80);
      free(local_8->sd->ldict);
    }
    free(local_8->sd);
  }
  local_e8 = 0;
  while (sVar12 = local_e8, sVar7 = v_array<int>::size(&local_8->final_prediction_sink),
        sVar12 < sVar7) {
    piVar8 = v_array<int>::operator[](&local_8->final_prediction_sink,local_e8);
    if (*piVar8 != 1) {
      in_stack_fffffffffffffea0 =
           (v_hashmap<substring,_features_*> *)
           v_array<int>::operator[](&local_8->final_prediction_sink,local_e8);
      io_buf::close_file_or_socket(0);
    }
    local_e8 = local_e8 + 1;
  }
  v_array<int>::delete_v((v_array<int> *)in_stack_fffffffffffffe80);
  local_f0 = (_func_void_substring_features_ptr *)0x0;
  while (func = local_f0,
        p_Var9 = (_func_void_substring_features_ptr *)
                 std::vector<dictionary_info,_std::allocator<dictionary_info>_>::size
                           (&local_8->loaded_dictionaries), func < p_Var9) {
    std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
              (&local_8->loaded_dictionaries,(size_type)local_f0);
    free_it((void *)0x144ef6);
    std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
              (&local_8->loaded_dictionaries,(size_type)local_f0);
    v_hashmap<substring,_features_*>::iter(in_stack_fffffffffffffea0,func);
    std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
              (&local_8->loaded_dictionaries,(size_type)local_f0);
    v_hashmap<substring,_features_*>::delete_v((v_hashmap<substring,_features_*> *)0x144f4b);
    std::vector<dictionary_info,_std::allocator<dictionary_info>_>::operator[]
              (&local_8->loaded_dictionaries,(size_type)local_f0);
    free_it((void *)0x144f72);
    local_f0 = local_f0 + 1;
  }
  this = (vw *)local_8->loss;
  if (this != (vw *)0x0) {
    (*(code *)this->sd->sum_loss_since_last_dump)();
  }
  ex = (vw_exception *)local_8->all_reduce;
  if (ex != (vw_exception *)0x0) {
    (**(code **)(*(long *)ex + 8))();
  }
  if (((local_9 & 1) != 0) && (in_stack_fffffffffffffe80 = local_8, local_8 != (vw *)0x0)) {
    vw::~vw(this);
    operator_delete(local_8);
    in_stack_fffffffffffffe80 = local_8;
  }
  if ((local_aa & 1) != 0) {
    uVar10 = __cxa_allocate_exception(0x38);
    vw_exception::vw_exception((vw_exception *)this,ex);
    __cxa_throw(uVar10,&vw_exception::typeinfo,vw_exception::~vw_exception);
  }
  vw_exception::~vw_exception((vw_exception *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void finish(vw& all, bool delete_all)
{
  // also update VowpalWabbit::PerformanceStatistics::get() (vowpalwabbit.cpp)
  if (!all.quiet && !all.options->was_supplied("audit_regressor"))
  {
    all.trace_message.precision(6);
    all.trace_message << std::fixed;
    all.trace_message << endl << "finished run";
    if (all.current_pass == 0 || all.current_pass == 1)
      all.trace_message << endl << "number of examples = " << all.sd->example_number;
    else
    {
      all.trace_message << endl << "number of examples per pass = " << all.sd->example_number / all.current_pass;
      all.trace_message << endl << "passes used = " << all.current_pass;
    }
    all.trace_message << endl << "weighted example sum = " << all.sd->weighted_examples();
    all.trace_message << endl << "weighted label sum = " << all.sd->weighted_labels;
    all.trace_message << endl << "average loss = ";
    if (all.holdout_set_off)
      if (all.sd->weighted_labeled_examples > 0)
        all.trace_message << all.sd->sum_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << "n.a.";
    else if ((all.sd->holdout_best_loss == FLT_MAX) || (all.sd->holdout_best_loss == FLT_MAX * 0.5))
      all.trace_message << "undefined (no holdout)";
    else
      all.trace_message << all.sd->holdout_best_loss << " h";
    if (all.sd->report_multiclass_log_loss)
    {
      if (all.holdout_set_off)
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->multiclass_log_loss / all.sd->weighted_labeled_examples;
      else
        all.trace_message << endl
                          << "average multiclass log loss = "
                          << all.sd->holdout_multiclass_log_loss / all.sd->weighted_labeled_examples << " h";
    }

    float best_constant;
    float best_constant_loss;
    if (get_best_constant(all, best_constant, best_constant_loss))
    {
      all.trace_message << endl << "best constant = " << best_constant;
      if (best_constant_loss != FLT_MIN)
        all.trace_message << endl << "best constant's loss = " << best_constant_loss;
    }

    all.trace_message << endl << "total feature number = " << all.sd->total_features;
    if (all.sd->queries > 0)
      all.trace_message << endl << "total queries = " << all.sd->queries;
    all.trace_message << endl;
  }

  // implement finally.
  // finalize_regressor can throw if it can't write the file.
  // we still want to free up all the memory.
  vw_exception finalize_regressor_exception(__FILE__, __LINE__, "empty");
  bool finalize_regressor_exception_thrown = false;
  try
  {
    finalize_regressor(all, all.final_regressor_name);
  }
  catch (vw_exception& e)
  {
    finalize_regressor_exception = e;
    finalize_regressor_exception_thrown = true;
  }

  if (all.l != nullptr)
  {
    all.l->finish();
    free_it(all.l);
  }

  // Check if options object lifetime is managed internally.
  if (all.should_delete_options)
    delete all.options;

  // TODO: migrate all finalization into parser destructor
  free_parser(all);
  finalize_source(all.p);
  all.p->parse_name.clear();
  all.p->parse_name.delete_v();
  delete all.p;
  bool seeded;
  if (all.weights.seeded() > 0)
    seeded = true;
  else
    seeded = false;
  if (!seeded)
  {
    if (all.sd->ldict)
    {
      all.sd->ldict->~namedlabels();
      free(all.sd->ldict);
    }
    free(all.sd);
  }
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
    if (all.final_prediction_sink[i] != 1)
      io_buf::close_file_or_socket(all.final_prediction_sink[i]);
  all.final_prediction_sink.delete_v();
  for (size_t i = 0; i < all.loaded_dictionaries.size(); i++)
  {
    // Warning C6001 is triggered by the following:
    // (a) dictionary_info.name is allocated using 'calloc_or_throw<char>(strlen(s)+1)' and (b) freed using
    // 'free(all.loaded_dictionaries[i].name)'
    //
    // When the call to allocation is replaced by (a) 'new char[strlen(s)+1]' and deallocated using (b) 'delete []', the
    // warning goes away. Disable SDL warning.
    //    #pragma warning(disable:6001)
    free_it(all.loaded_dictionaries[i].name);
    //#pragma warning(default:6001)

    all.loaded_dictionaries[i].dict->iter(delete_dictionary_entry);
    all.loaded_dictionaries[i].dict->delete_v();
    free_it(all.loaded_dictionaries[i].dict);
  }
  delete all.loss;

  delete all.all_reduce;

  if (delete_all)
    delete &all;

  if (finalize_regressor_exception_thrown)
    throw finalize_regressor_exception;
}